

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O1

TestRequired * google::protobuf::DownCastMessage<edition_unittest::TestRequired>(MessageLite *from)

{
  int iVar1;
  long lVar2;
  undefined4 extraout_var;
  LogMessage *this;
  MessageLite *pMVar3;
  string_view str;
  string_view sVar4;
  LogMessage local_20;
  
  if (from == (MessageLite *)0x0) {
    pMVar3 = (MessageLite *)0x0;
  }
  else {
    lVar2 = (**(code **)(edition_unittest::_TestRequired_default_instance_ + 0x20))();
    iVar1 = (*from->_vptr_MessageLite[4])(from);
    pMVar3 = (MessageLite *)0x0;
    if (lVar2 == CONCAT44(extraout_var,iVar1)) {
      pMVar3 = from;
    }
  }
  if (pMVar3 != from) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.h"
               ,0x595,"DynamicCastMessage<T>(from) == from");
    sVar4._M_str = "Cannot downcast ";
    sVar4._M_len = 0x10;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              (&local_20,sVar4);
    sVar4 = MessageLite::GetTypeName(from);
    this = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_20,sVar4);
    str._M_str = " to ";
    str._M_len = 4;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(this,str);
    sVar4 = MessageLite::GetTypeName
                      ((MessageLite *)&edition_unittest::_TestRequired_default_instance_);
    absl::lts_20250127::log_internal::LogMessage::operator<<(this,sVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_20);
  }
  return (TestRequired *)from;
}

Assistant:

const T* DownCastMessage(const MessageLite* from) {
  internal::StrongReferenceToType<T>();
  ABSL_DCHECK(DynamicCastMessage<T>(from) == from)
      << "Cannot downcast " << from->GetTypeName() << " to "
      << T::default_instance().GetTypeName();
  return static_cast<const T*>(from);
}